

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::js::api::json::UpdateWitnessStackTxInRequest::ConvertFromStruct
          (UpdateWitnessStackTxInRequest *this,UpdateWitnessStackTxInRequestStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->txid_);
  this->vout_ = data->vout;
  WitnessStackData::ConvertFromStruct(&this->witness_stack_,&data->witness_stack);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void UpdateWitnessStackTxInRequest::ConvertFromStruct(
    const UpdateWitnessStackTxInRequestStruct& data) {
  txid_ = data.txid;
  vout_ = data.vout;
  witness_stack_.ConvertFromStruct(data.witness_stack);
  ignore_items = data.ignore_items;
}